

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkmanagerservice.cpp
# Opt level: O3

void __thiscall QNetworkManagerInterface::~QNetworkManagerInterface(QNetworkManagerInterface *this)

{
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QArrayData *local_d8;
  char16_t *pcStack_d0;
  qsizetype local_c8;
  QString local_b8;
  QString local_98;
  QString local_78;
  QString local_60;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusConnection::systemBus();
  QVar1.m_data = (storage_type *)0x1e;
  QVar1.m_size = (qsizetype)&local_60.d.ptr;
  QString::fromLatin1(QVar1);
  local_78.d.d = (Data *)local_60.d.ptr;
  local_78.d.ptr = (char16_t *)local_60.d.size;
  local_78.d.size = local_48;
  QVar2.m_data = (storage_type *)0x1f;
  QVar2.m_size = (qsizetype)&local_60.d.ptr;
  QString::fromLatin1(QVar2);
  local_98.d.d = (Data *)local_60.d.ptr;
  local_98.d.ptr = (char16_t *)local_60.d.size;
  local_98.d.size = local_48;
  QVar3.m_data = (storage_type *)0x1f;
  QVar3.m_size = (qsizetype)&local_60.d.ptr;
  QString::fromLatin1(QVar3);
  local_b8.d.d = (Data *)local_60.d.ptr;
  local_b8.d.ptr = (char16_t *)local_60.d.size;
  local_b8.d.size = local_48;
  QVar4.m_data = (storage_type *)0x11;
  QVar4.m_size = (qsizetype)&local_60.d.ptr;
  QString::fromLatin1(QVar4);
  local_d8 = (QArrayData *)local_60.d.ptr;
  pcStack_d0 = (char16_t *)local_60.d.size;
  local_c8 = local_48;
  QDBusConnection::disconnect
            (&local_60,&local_78,&local_98,&local_b8,(QObject *)&local_d8,(char *)this);
  if (local_d8 != (QArrayData *)0x0) {
    LOCK();
    (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_d8,2,0x10);
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  QDBusConnection::~QDBusConnection((QDBusConnection *)&local_60);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
              *)(this + 0x10));
  QDBusAbstractInterface::~QDBusAbstractInterface((QDBusAbstractInterface *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkManagerInterface::~QNetworkManagerInterface()
{
    QDBusConnection::systemBus().disconnect(NM_DBUS_SERVICE, NM_DBUS_PATH,
            DBUS_PROPERTIES_INTERFACE, propertiesChangedKey, this,
            SLOT(setProperties(QString,QMap<QString,QVariant>,QList<QString>)));
}